

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O0

QByteArray * __thiscall QNetworkCookie::toRawForm(QNetworkCookie *this,RawForm form)

{
  bool bVar1;
  NetworkLayerProtocol NVar2;
  QNetworkCookiePrivate *pQVar3;
  ulong uVar4;
  int in_EDX;
  char *pcVar5;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  QLatin1StringView QVar7;
  QByteArray *result;
  QHostAddress hostAddr;
  undefined7 in_stack_fffffffffffffe98;
  char in_stack_fffffffffffffe9f;
  QString *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  QString *pQVar8;
  QString *pQVar9;
  QDateTime *dateTime;
  QLocale *in_stack_fffffffffffffed8;
  undefined1 local_dc [4];
  undefined1 local_d8 [48];
  undefined8 local_a8;
  undefined1 local_9c [4];
  undefined1 local_98 [24];
  undefined1 local_80 [30];
  QChar local_62 [13];
  QDateTime local_48 [8];
  QLocale local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  pQVar9 = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x1b23fb);
  QSharedDataPointer<QNetworkCookiePrivate>::operator->
            ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b2405);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x1b2411);
  if (!bVar1) {
    pQVar3 = QSharedDataPointer<QNetworkCookiePrivate>::operator->
                       ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b2433);
    QByteArray::operator=((QByteArray *)in_RDI,&pQVar3->name);
    QByteArray::operator+=((QByteArray *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9f);
    QSharedDataPointer<QNetworkCookiePrivate>::operator->
              ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b245d);
    QByteArray::operator+=
              ((QByteArray *)in_stack_fffffffffffffea0,
               (QByteArray *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    if (in_EDX == 1) {
      bVar1 = isSecure((QNetworkCookie *)0x1b2483);
      if (bVar1) {
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffea0,
                   (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      }
      bVar1 = isHttpOnly((QNetworkCookie *)0x1b24a4);
      if (bVar1) {
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffea0,
                   (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      }
      pQVar3 = QSharedDataPointer<QNetworkCookiePrivate>::operator->
                         ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b24c5);
      if (pQVar3->sameSite != Default) {
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffea0,
                   (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        QSharedDataPointer<QNetworkCookiePrivate>::operator->
                  ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b24e9);
        QVar6 = anon_unknown.dwarf_14705c::sameSiteToRawString
                          ((SameSite)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        in_stack_fffffffffffffed8 = (QLocale *)QVar6.m_size;
        QVar6.m_data = (storage_type *)pQVar9;
        QVar6.m_size = (qsizetype)in_RDI;
        QByteArray::operator+=
                  ((QByteArray *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),QVar6
                  );
      }
      bVar1 = isSessionCookie((QNetworkCookie *)0x1b251c);
      if (!bVar1) {
        pcVar5 = "; expires=";
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffea0,
                   (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        QLocale::c(local_40,pcVar5);
        QSharedDataPointer<QNetworkCookiePrivate>::operator->
                  ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b254c);
        QDateTime::toUTC();
        QVar7 = Qt::Literals::StringLiterals::operator____L1
                          (in_stack_fffffffffffffea8,(size_t)in_stack_fffffffffffffea0);
        pQVar8 = (QString *)QVar7.m_size;
        dateTime = (QDateTime *)QVar7.m_data;
        QVar7.m_data = (char *)in_stack_fffffffffffffed8;
        QVar7.m_size = (qsizetype)dateTime;
        QString::QString(in_RDI,QVar7);
        QLocale::toString(in_stack_fffffffffffffed8,dateTime,pQVar8);
        QString::toLatin1((QString *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffea0,
                   (QByteArray *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        QByteArray::~QByteArray((QByteArray *)0x1b25eb);
        QString::~QString((QString *)0x1b25f8);
        QString::~QString((QString *)0x1b2605);
        QDateTime::~QDateTime(local_48);
        QLocale::~QLocale(local_40);
      }
      QSharedDataPointer<QNetworkCookiePrivate>::operator->
                ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b2629);
      bVar1 = QString::isEmpty((QString *)0x1b2635);
      if (!bVar1) {
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffea0,
                   (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        pQVar3 = QSharedDataPointer<QNetworkCookiePrivate>::operator->
                           ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b2658);
        pQVar8 = &pQVar3->domain;
        QChar::QChar<char16_t,_true>(local_62,L'.');
        uVar4 = QString::startsWith((QChar)(char16_t)pQVar8,(uint)(ushort)local_62[0].ucs);
        if ((uVar4 & 1) == 0) {
          local_a8 = 0xaaaaaaaaaaaaaaaa;
          QSharedDataPointer<QNetworkCookiePrivate>::operator->
                    ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b2753);
          QHostAddress::QHostAddress((QHostAddress *)in_RDI,pQVar8);
          NVar2 = QHostAddress::protocol((QHostAddress *)0x1b2774);
          if (NVar2 == IPv6Protocol) {
            QByteArray::operator+=
                      ((QByteArray *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9f);
            QSharedDataPointer<QNetworkCookiePrivate>::operator->
                      ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b2792);
            QString::toUtf8((QString *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98)
                           );
            QByteArray::operator+=
                      ((QByteArray *)in_stack_fffffffffffffea0,
                       (QByteArray *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
            QByteArray::~QByteArray((QByteArray *)0x1b27c5);
            QByteArray::operator+=
                      ((QByteArray *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9f);
          }
          else {
            pQVar3 = QSharedDataPointer<QNetworkCookiePrivate>::operator->
                               ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b27e0);
            in_stack_fffffffffffffea0 = &pQVar3->domain;
            memset(local_dc,0,4);
            QFlags<QUrl::AceProcessingOption>::QFlags((QFlags<QUrl::AceProcessingOption> *)0x1b280a)
            ;
            QUrl::toAce((QString *)local_d8,(QFlags_conflict *)in_stack_fffffffffffffea0);
            QByteArray::operator+=
                      ((QByteArray *)in_stack_fffffffffffffea0,
                       (QByteArray *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
            QByteArray::~QByteArray((QByteArray *)0x1b2842);
          }
          QHostAddress::~QHostAddress((QHostAddress *)0x1b284f);
        }
        else {
          QByteArray::operator+=((QByteArray *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9f);
          pQVar3 = QSharedDataPointer<QNetworkCookiePrivate>::operator->
                             ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b26ac);
          QString::mid((longlong)local_98,(longlong)&pQVar3->domain);
          memset(local_9c,0,4);
          QFlags<QUrl::AceProcessingOption>::QFlags((QFlags<QUrl::AceProcessingOption> *)0x1b26ed);
          QUrl::toAce((QString *)local_80,(QFlags_conflict *)local_98);
          QByteArray::operator+=
                    ((QByteArray *)in_stack_fffffffffffffea0,
                     (QByteArray *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
          QByteArray::~QByteArray((QByteArray *)0x1b2728);
          QString::~QString((QString *)0x1b2735);
        }
      }
      QSharedDataPointer<QNetworkCookiePrivate>::operator->
                ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b285b);
      bVar1 = QString::isEmpty((QString *)0x1b2867);
      if (!bVar1) {
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffea0,
                   (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        QSharedDataPointer<QNetworkCookiePrivate>::operator->
                  ((QSharedDataPointer<QNetworkCookiePrivate> *)0x1b2886);
        QString::toUtf8((QString *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        QByteArray::operator+=
                  ((QByteArray *)in_stack_fffffffffffffea0,
                   (QByteArray *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
        QByteArray::~QByteArray((QByteArray *)0x1b28b0);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QByteArray *)pQVar9;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QNetworkCookie::toRawForm(RawForm form) const
{
    QByteArray result;
    if (d->name.isEmpty())
        return result;          // not a valid cookie

    result = d->name;
    result += '=';
    result += d->value;

    if (form == Full) {
        // same as above, but encoding everything back
        if (isSecure())
            result += "; secure";
        if (isHttpOnly())
            result += "; HttpOnly";
        if (d->sameSite != SameSite::Default) {
            result += "; SameSite=";
            result += sameSiteToRawString(d->sameSite);
        }
        if (!isSessionCookie()) {
            result += "; expires=";
            result += QLocale::c().toString(d->expirationDate.toUTC(),
                                            "ddd, dd-MMM-yyyy hh:mm:ss 'GMT"_L1).toLatin1();
        }
        if (!d->domain.isEmpty()) {
            result += "; domain=";
            if (d->domain.startsWith(u'.')) {
                result += '.';
                result += QUrl::toAce(d->domain.mid(1));
            } else {
                QHostAddress hostAddr(d->domain);
                if (hostAddr.protocol() == QAbstractSocket::IPv6Protocol) {
                    result += '[';
                    result += d->domain.toUtf8();
                    result += ']';
                } else {
                    result += QUrl::toAce(d->domain);
                }
            }
        }
        if (!d->path.isEmpty()) {
            result += "; path=";
            result += d->path.toUtf8();
        }
    }
    return result;
}